

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddDivideF(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  DdNode *n;
  DdNode *n_00;
  int flag;
  DdNode *tmp;
  DdNode *r;
  DdNode *q;
  DdNode *g1;
  DdNode *g0;
  DdNode *f1;
  DdNode *f0;
  DdNode *zero;
  DdNode *one;
  DdNode *pDStack_28;
  int v;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  f0 = dd->zero;
  dd_local = (DdManager *)f;
  if ((((g != zero) && (dd_local = (DdManager *)f0, f != f0)) && (f != zero)) &&
     ((dd_local = (DdManager *)zero, f != g &&
      (pDStack_28 = g, g_local = f, f_local = &dd->sentinel,
      dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,cuddZddDivideF,f,g),
      dd_local == (DdManager *)0x0)))) {
    one._4_4_ = pDStack_28->index;
    iVar1 = cuddZddGetCofactors2((DdManager *)f_local,g_local,one._4_4_,&g0,&f1);
    if (iVar1 == 1) {
      dd_local = (DdManager *)0x0;
    }
    else {
      Cudd_Ref(g0);
      Cudd_Ref(f1);
      iVar1 = cuddZddGetCofactors2((DdManager *)f_local,pDStack_28,one._4_4_,&q,&g1);
      if (iVar1 == 1) {
        Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
        Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(q);
        Cudd_Ref(g1);
        n = cuddZddDivideF((DdManager *)f_local,g0,q);
        if (n == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(n);
          tmp = n;
          if ((n != f0) && (g1 != f0)) {
            n_00 = cuddZddDivideF((DdManager *)f_local,f1,g1);
            if (n_00 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
              return (DdNode *)0x0;
            }
            Cudd_Ref(n_00);
            tmp = cuddZddIntersect((DdManager *)f_local,n,n_00);
            if (tmp == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
              return (DdNode *)0x0;
            }
            Cudd_Ref(tmp);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,n);
          }
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
          cuddCacheInsert2((DdManager *)f_local,cuddZddDivideF,g_local,pDStack_28,tmp);
          Cudd_Deref(tmp);
          dd_local = (DdManager *)tmp;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddDivideF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *g0, *g1;
    DdNode      *q, *r, *tmp;
    int         flag;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddDivideF, f, g);
    if (r)
        return(r);

    v = g->index;

    flag = cuddZddGetCofactors2(dd, f, v, &f1, &f0);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    flag = cuddZddGetCofactors2(dd, g, v, &g1, &g0);    /* g1 != zero */
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);

    r = cuddZddDivideF(dd, f1, g1);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        return(NULL);
    }
    Cudd_Ref(r);

    if (r != zero && g0 != zero) {
        tmp = r;
        q = cuddZddDivideF(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            return(NULL);
        }
        Cudd_Ref(q);
        r = cuddZddIntersect(dd, r, q);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, q);
            return(NULL);
        }
        Cudd_Ref(r);
        Cudd_RecursiveDerefZdd(dd, q);
        Cudd_RecursiveDerefZdd(dd, tmp);
    }

    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, g0);
    
    cuddCacheInsert2(dd, cuddZddDivideF, f, g, r);
    Cudd_Deref(r);
    return(r);

}